

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

uint Extra_CountCofactorMinterms(DdManager *dd,DdNode *bFunc,DdNode *bVarsCof,DdNode *bVarsAll)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  DdNode *pDVar8;
  int iVar9;
  DdNode *bFunc_00;
  int iVar10;
  DdNode *pDVar11;
  DdNode *bFunc_01;
  int iVar12;
  DdNode *pDVar13;
  
  pDVar13 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  uVar7 = (long)bFunc * 0xc00005 + (ulong)s_Signature;
  while( true ) {
    uVar7 = uVar7 % 0xc7a9;
    if (HHTable1[uVar7].Sign != s_Signature) break;
    if (HHTable1[uVar7].Arg1 == bFunc) {
      return 0;
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  piVar3 = dd->perm;
  iVar1 = piVar3[pDVar13->index];
  if (s_EncodingVarsLevel <= iVar1) {
    bVar4 = (byte)s_MultiStart & 0x1f;
    HHTable1[uVar7].Sign = s_Signature;
    HHTable1[uVar7].Arg1 = bFunc;
    uVar5 = Extra_CountMintermsSimple(bFunc,1 << bVar4);
    return uVar5;
  }
  pDVar8 = (DdNode *)((ulong)bVarsCof & 0xfffffffffffffffe);
  iVar9 = 0x7fffffff;
  if ((ulong)pDVar8->index != 0x7fffffff) {
    iVar9 = piVar3[pDVar8->index];
  }
  iVar2 = piVar3[bVarsAll->index];
  iVar12 = iVar9;
  if (iVar1 < iVar9) {
    iVar12 = iVar1;
  }
  iVar10 = iVar2;
  if (iVar12 < iVar2) {
    iVar10 = iVar12;
  }
  if ((iVar12 < iVar2) && (iVar10 == iVar1 || iVar10 == iVar9)) {
    __assert_fail("!( LevelTop == LevelF || LevelTop == LevelC ) || LevelTop == LevelA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                  ,0x3d1,
                  "unsigned int Extra_CountCofactorMinterms(DdManager *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  bFunc_00 = bFunc;
  bFunc_01 = bFunc;
  if (iVar10 == iVar1) {
    bFunc_00 = (pDVar13->type).kids.E;
    if (pDVar13 == bFunc) {
      bFunc_01 = (pDVar13->type).kids.T;
    }
    else {
      bFunc_00 = (DdNode *)((ulong)bFunc_00 ^ 1);
      bFunc_01 = (DdNode *)((ulong)(pDVar13->type).kids.T ^ 1);
    }
  }
  if (iVar10 != iVar9) {
    pDVar13 = (DdNode *)((ulong)dd->one ^ 1);
    if (bFunc_00 == pDVar13) {
      uVar5 = 0;
    }
    else {
      uVar5 = Extra_CountCofactorMinterms(dd,bFunc_00,bVarsCof,(bVarsAll->type).kids.T);
      pDVar13 = (DdNode *)((ulong)dd->one ^ 1);
    }
    if (bFunc_01 != pDVar13) {
      uVar6 = Extra_CountCofactorMinterms(dd,bFunc_01,bVarsCof,(bVarsAll->type).kids.T);
      uVar5 = uVar5 + uVar6;
    }
    goto LAB_00642650;
  }
  pDVar13 = (pDVar8->type).kids.E;
  if (pDVar8 == bVarsCof) {
    pDVar8 = (pDVar8->type).kids.T;
  }
  else {
    pDVar13 = (DdNode *)((ulong)pDVar13 ^ 1);
    pDVar8 = (DdNode *)((ulong)(pDVar8->type).kids.T ^ 1);
  }
  pDVar11 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar8 == pDVar11) {
    if (bFunc_00 == pDVar8) goto LAB_00642642;
    pDVar11 = (bVarsAll->type).kids.T;
  }
  else {
    if (bFunc_01 == pDVar11) {
LAB_00642642:
      uVar5 = 0;
      goto LAB_00642650;
    }
    pDVar11 = (bVarsAll->type).kids.T;
    pDVar13 = pDVar8;
    bFunc_00 = bFunc_01;
  }
  uVar5 = Extra_CountCofactorMinterms(dd,bFunc_00,pDVar13,pDVar11);
LAB_00642650:
  for (; HHTable1[uVar7].Sign == s_Signature; uVar7 = (ulong)((int)uVar7 + 1) % 0xc7a9) {
  }
  HHTable1[uVar7].Sign = s_Signature;
  HHTable1[uVar7].Arg1 = bFunc;
  return uVar5;
}

Assistant:

unsigned Extra_CountCofactorMinterms( DdManager * dd, DdNode * bFunc, DdNode * bVarsCof, DdNode * bVarsAll )
// this function computes how many minterms depending on the encoding variables
// are there in the cofactor of bFunc w.r.t. variables bVarsCof
// bFunc is assumed to depend on variables s_VarsAll
// the variables s_VarsAll should be ordered above the encoding variables
{
    unsigned HKey;
    DdNode * bFuncR;

    // if the function is zero, there are no minterms
//  if ( bFunc == b0 )
//      return 0;

//  if ( st__lookup(Visited, (char*)bFunc, NULL) )
//      return 0;

//  HKey = hashKey2c( s_Signature, bFuncR );
//  if ( HHTable1[HKey].Sign == s_Signature && HHTable1[HKey].Arg1 == bFuncR ) // this node is visited
//      return 0;


    // check the hash-table 
    bFuncR = Cudd_Regular(bFunc);
//  HKey = hashKey2( s_Signature, bFuncR, _TABLESIZE_COF );
    HKey = hashKey2( s_Signature, bFunc, _TABLESIZE_COF );
    for ( ;  HHTable1[HKey].Sign == s_Signature; HKey = (HKey+1) % _TABLESIZE_COF )
//      if ( HHTable1[HKey].Arg1 == bFuncR ) // this node is visited
        if ( HHTable1[HKey].Arg1 == bFunc ) // this node is visited
            return 0;


    // if the function is already the code
    if ( dd->perm[bFuncR->index] >= s_EncodingVarsLevel )
    {
//      st__insert(Visited, (char*)bFunc, NULL);

//      HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;

        assert( HHTable1[HKey].Sign != s_Signature );
        HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;
        HHTable1[HKey].Arg1 = bFunc;

        return Extra_CountMintermsSimple( bFunc, (1<<s_MultiStart) );
    }
    else
    {
        DdNode * bFunc0,    * bFunc1;
        DdNode * bVarsCof0, * bVarsCof1;
        DdNode * bVarsCofR = Cudd_Regular(bVarsCof);
        unsigned Res;

        // get the levels
        int LevelF = dd->perm[bFuncR->index];
        int LevelC = cuddI(dd,bVarsCofR->index);
        int LevelA = dd->perm[bVarsAll->index];

        int LevelTop = LevelF;

        if ( LevelTop > LevelC )
             LevelTop = LevelC;

        if ( LevelTop > LevelA )
             LevelTop = LevelA;

        // the top var in the function or in cofactoring vars always belongs to the set of all vars
        assert( !( LevelTop == LevelF || LevelTop == LevelC ) || LevelTop == LevelA );

        // cofactor the function
        if ( LevelTop == LevelF )
        {
            if ( bFuncR != bFunc ) // bFunc is complemented 
            {
                bFunc0 = Cudd_Not( cuddE(bFuncR) );
                bFunc1 = Cudd_Not( cuddT(bFuncR) );
            }
            else
            {
                bFunc0 = cuddE(bFuncR);
                bFunc1 = cuddT(bFuncR);
            }
        }
        else // bVars is higher in the variable order 
            bFunc0 = bFunc1 = bFunc;

        // cofactor the cube
        if ( LevelTop == LevelC )
        {
            if ( bVarsCofR != bVarsCof ) // bFunc is complemented 
            {
                bVarsCof0 = Cudd_Not( cuddE(bVarsCofR) );
                bVarsCof1 = Cudd_Not( cuddT(bVarsCofR) );
            }
            else
            {
                bVarsCof0 = cuddE(bVarsCofR);
                bVarsCof1 = cuddT(bVarsCofR);
            }
        }
        else // bVars is higher in the variable order 
            bVarsCof0 = bVarsCof1 = bVarsCof;

        // there are two cases: 
        // (1) the top variable belongs to the cofactoring variables
        // (2) the top variable does not belong to the cofactoring variables

        // (1) the top variable belongs to the cofactoring variables
        Res = 0;
        if ( LevelTop == LevelC )
        {
            if ( bVarsCof1 == b0 ) // this is a negative cofactor
            {
                if ( bFunc0 != b0 )
                Res = Extra_CountCofactorMinterms( dd, bFunc0, bVarsCof0, cuddT(bVarsAll) );
            }
            else                        // this is a positive cofactor
            {
                if ( bFunc1 != b0 )
                Res = Extra_CountCofactorMinterms( dd, bFunc1, bVarsCof1, cuddT(bVarsAll) );
            }
        }
        else
        {
            if ( bFunc0 != b0 )
            Res += Extra_CountCofactorMinterms( dd, bFunc0, bVarsCof0, cuddT(bVarsAll) );
            
            if ( bFunc1 != b0 )
            Res += Extra_CountCofactorMinterms( dd, bFunc1, bVarsCof1, cuddT(bVarsAll) );
        }

//      st__insert(Visited, (char*)bFunc, NULL);

//      HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;

        // skip through the entries with the same signatures 
        // (these might have been created at the time of recursive calls)
        for ( ; HHTable1[HKey].Sign == s_Signature; HKey = (HKey+1) % _TABLESIZE_COF );
        assert( HHTable1[HKey].Sign != s_Signature );
        HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;
        HHTable1[HKey].Arg1 = bFunc;

        return Res;
    }
}